

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Output::matchEnumScalar(Output *this,char *Str,bool Match)

{
  undefined7 in_register_00000011;
  StringRef local_30;
  
  if (((int)CONCAT71(in_register_00000011,Match) != 0) && (this->EnumerationMatchFound == false)) {
    newLineCheck(this);
    StringRef::StringRef(&local_30,Str);
    outputUpToEndOfLine(this,local_30);
    this->EnumerationMatchFound = true;
  }
  return false;
}

Assistant:

bool Output::matchEnumScalar(const char *Str, bool Match) {
  if (Match && !EnumerationMatchFound) {
    newLineCheck();
    outputUpToEndOfLine(Str);
    EnumerationMatchFound = true;
  }
  return false;
}